

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minify_tests.c
# Opt level: O3

void cjson_minify_should_remove_single_line_comments(void)

{
  char *json;
  
  json = (char *)malloc(0x3d);
  if (json == (char *)0x0) {
    UnityFail(" Expected Non-NULL",0x31);
    uRam0000000000000030 = 0x6f79207427;
    uRam0000000000000035._0_1_ = 'u';
    uRam0000000000000035._1_1_ = ' ';
    uRam0000000000000035._2_1_ = 's';
    uRam0000000000000035._3_1_ = 'e';
    uRam0000000000000035._4_1_ = 'e';
    uRam0000000000000035._5_1_ = '\n';
    uRam0000000000000035._6_1_ = '}';
    uRam0000000000000035._7_1_ = '\0';
    DAT_00000020 = ' ';
    DAT_00000020_1._0_1_ = 'c';
    DAT_00000020_1._1_1_ = 'o';
    DAT_00000020_1._2_1_ = 'm';
    DAT_00000020_1._3_1_ = 'm';
    DAT_00000020_1._4_1_ = 'e';
    DAT_00000020_1._5_1_ = 'n';
    DAT_00000020_1._6_1_ = 't';
    uRam0000000000000028 = 0x202c2a2f20;
    _DAT_0000002d = 0x6e6f64;
    DAT_00000010 = 's';
    DAT_00000010_1._0_1_ = 'o';
    DAT_00000010_1._1_1_ = 'm';
    DAT_00000010_1._2_1_ = 'e';
    DAT_00000010_1._3_1_ = ' ';
    DAT_00000010_1._4_1_ = 'k';
    DAT_00000010_1._5_1_ = 'i';
    DAT_00000010_1._6_1_ = 'n';
    uRam0000000000000018._0_1_ = 'd';
    uRam0000000000000018._1_1_ = '\"';
    uRam0000000000000018._2_1_ = ' ';
    uRam0000000000000018._3_1_ = 'o';
    uRam0000000000000018._4_1_ = 'f';
    uRam0000000000000018._5_1_ = ' ';
    uRam0000000000000018._6_1_ = '[';
    uRam0000000000000018._7_1_ = ']';
    DAT_00000000 = '{';
    DAT_00000000_1._0_1_ = '/';
    DAT_00000000_1._1_1_ = '/';
    DAT_00000000_1._2_1_ = ' ';
    DAT_00000000_1._3_1_ = 't';
    DAT_00000000_1._4_1_ = 'h';
    DAT_00000000_1._5_1_ = 'i';
    DAT_00000000_1._6_1_ = 's';
    uRam0000000000000008._0_1_ = ' ';
    uRam0000000000000008._1_1_ = 'i';
    uRam0000000000000008._2_1_ = 's';
    uRam0000000000000008._3_1_ = ' ';
    uRam0000000000000008._4_1_ = '{';
    DAT_0000000d = '}';
    uRam0000000000000008._6_1_ = ' ';
    uRam0000000000000008._7_1_ = '\"';
  }
  else {
    builtin_strncpy(json,"{// this is {} \"some kind\" of [] comment /*, don\'t you see\n}",0x3d);
    cJSON_Minify(json);
  }
  UnityAssertEqualString("{}",json,(char *)0x0,0x35);
  free(json);
  return;
}

Assistant:

static void cjson_minify_should_remove_single_line_comments(void)
{
    const char to_minify[] = "{// this is {} \"some kind\" of [] comment /*, don't you see\n}";

    char* minified = (char*) malloc(sizeof(to_minify));
    TEST_ASSERT_NOT_NULL(minified);
    strcpy(minified, to_minify);

    cJSON_Minify(minified);
    TEST_ASSERT_EQUAL_STRING("{}", minified);

    free(minified);
}